

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void embree::SceneGraph::resize_randomly
               (RandomSampler *sampler,Ref<embree::SceneGraph::Node> *node,size_t N)

{
  Triangle *__args;
  Hair *__args_00;
  undefined4 uVar1;
  Node *pNVar2;
  long lVar3;
  iterator __position;
  undefined8 uVar4;
  iterator __position_00;
  iterator __position_01;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  Quad *__args_01;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar2 = node->ptr;
  if (pNVar2 != (Node *)0x0) {
    plVar10 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar10 == (long *)0x0) {
      plVar10 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&GroupNode::typeinfo,0);
      if (plVar10 == (long *)0x0) {
        plVar10 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        if (plVar10 == (long *)0x0) {
          plVar10 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar10 == (long *)0x0) {
            plVar10 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&HairSetNode::typeinfo,0);
            if (plVar10 == (long *)0x0) {
              plVar10 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&PointSetNode::typeinfo,0);
              if (plVar10 == (long *)0x0) {
                plVar10 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&SubdivMeshNode::typeinfo,0)
                ;
                if (plVar10 != (long *)0x0) {
                  (**(code **)(*plVar10 + 0x10))(plVar10);
                  if (N < (ulong)(plVar10[0x23] - plVar10[0x22] >> 2)) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               (plVar10 + 0x22),N);
                    (**(code **)(*plVar10 + 0x18))(plVar10);
                  }
                  else {
                    (**(code **)(*plVar10 + 0x18))(plVar10);
                  }
                }
              }
              else {
                (**(code **)(*plVar10 + 0x10))(plVar10);
                if (N < (ulong)(plVar10[0x10] - plVar10[0xf] >> 5)) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(plVar10 + 0xf),N);
                  (**(code **)(*plVar10 + 0x18))(plVar10);
                }
                else {
                  (**(code **)(*plVar10 + 0x18))(plVar10);
                }
              }
            }
            else {
              (**(code **)(*plVar10 + 0x10))(plVar10);
              if (plVar10[0x1c] == plVar10[0x1b]) {
                (**(code **)(*plVar10 + 0x18))(plVar10);
              }
              else {
                if (N != 0) {
                  uVar13 = 0;
                  do {
                    uVar9 = sampler->s * 0x19660d + 0x3c6ef35f;
                    sampler->s = uVar9;
                    lVar16 = plVar10[0x1b];
                    __position_01._M_current = (Hair *)plVar10[0x1c];
                    uVar14 = (long)__position_01._M_current - lVar16 >> 3;
                    sVar15 = N;
                    if (uVar14 < N) {
                      sVar15 = uVar14;
                    }
                    uVar11 = (ulong)(uVar9 >> 1) % sVar15;
                    if (uVar13 < uVar14) {
                      uVar4 = *(undefined8 *)(lVar16 + uVar13 * 8);
                      *(undefined8 *)(lVar16 + uVar13 * 8) = *(undefined8 *)(lVar16 + uVar11 * 8);
                      *(undefined8 *)(lVar16 + uVar11 * 8) = uVar4;
                    }
                    else {
                      __args_00 = (Hair *)(lVar16 + uVar11 * 8);
                      if (__position_01._M_current == (Hair *)plVar10[0x1d]) {
                        std::
                        vector<embree::SceneGraph::HairSetNode::Hair,std::allocator<embree::SceneGraph::HairSetNode::Hair>>
                        ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair_const&>
                                  ((vector<embree::SceneGraph::HairSetNode::Hair,std::allocator<embree::SceneGraph::HairSetNode::Hair>>
                                    *)(plVar10 + 0x1b),__position_01,__args_00);
                      }
                      else {
                        *__position_01._M_current = *__args_00;
                        plVar10[0x1c] = plVar10[0x1c] + 8;
                      }
                    }
                    uVar13 = uVar13 + 1;
                  } while (N != uVar13);
                }
                (**(code **)(*plVar10 + 0x18))(plVar10);
              }
            }
          }
          else {
            (**(code **)(*plVar10 + 0x10))(plVar10);
            if (plVar10[0x18] == plVar10[0x17]) {
              (**(code **)(*plVar10 + 0x18))(plVar10);
            }
            else {
              if (N != 0) {
                lVar16 = 0;
                uVar13 = 0;
                do {
                  uVar9 = sampler->s * 0x19660d + 0x3c6ef35f;
                  sampler->s = uVar9;
                  lVar3 = plVar10[0x17];
                  __position_00._M_current = (Quad *)plVar10[0x18];
                  uVar14 = (long)__position_00._M_current - lVar3 >> 4;
                  sVar15 = N;
                  if (uVar14 < N) {
                    sVar15 = uVar14;
                  }
                  lVar12 = ((ulong)(uVar9 >> 1) % sVar15) * 0x10;
                  if (uVar13 < uVar14) {
                    uVar4 = *(undefined8 *)(lVar3 + lVar16);
                    uVar5 = ((undefined8 *)(lVar3 + lVar16))[1];
                    uVar6 = ((undefined8 *)(lVar3 + lVar12))[1];
                    *(undefined8 *)(lVar3 + lVar16) = *(undefined8 *)(lVar3 + lVar12);
                    ((undefined8 *)(lVar3 + lVar16))[1] = uVar6;
                    *(undefined8 *)(lVar3 + lVar12) = uVar4;
                    ((undefined8 *)(lVar3 + lVar12))[1] = uVar5;
                  }
                  else {
                    __args_01 = (Quad *)(lVar3 + lVar12);
                    if (__position_00._M_current == (Quad *)plVar10[0x19]) {
                      std::
                      vector<embree::SceneGraph::QuadMeshNode::Quad,std::allocator<embree::SceneGraph::QuadMeshNode::Quad>>
                      ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad_const&>
                                ((vector<embree::SceneGraph::QuadMeshNode::Quad,std::allocator<embree::SceneGraph::QuadMeshNode::Quad>>
                                  *)(plVar10 + 0x17),__position_00,__args_01);
                    }
                    else {
                      uVar9 = __args_01->v1;
                      uVar7 = __args_01->v2;
                      uVar8 = __args_01->v3;
                      (__position_00._M_current)->v0 = __args_01->v0;
                      (__position_00._M_current)->v1 = uVar9;
                      (__position_00._M_current)->v2 = uVar7;
                      (__position_00._M_current)->v3 = uVar8;
                      plVar10[0x18] = plVar10[0x18] + 0x10;
                    }
                  }
                  uVar13 = uVar13 + 1;
                  lVar16 = lVar16 + 0x10;
                } while (N != uVar13);
              }
              (**(code **)(*plVar10 + 0x18))(plVar10);
            }
          }
        }
        else {
          (**(code **)(*plVar10 + 0x10))(plVar10);
          if (plVar10[0x18] == plVar10[0x17]) {
            (**(code **)(*plVar10 + 0x18))(plVar10);
          }
          else {
            if (N != 0) {
              lVar16 = 0;
              uVar13 = 0;
              do {
                uVar9 = sampler->s * 0x19660d + 0x3c6ef35f;
                sampler->s = uVar9;
                lVar3 = plVar10[0x17];
                __position._M_current = (Triangle *)plVar10[0x18];
                uVar14 = ((long)__position._M_current - lVar3 >> 2) * -0x5555555555555555;
                sVar15 = N;
                if (uVar14 < N) {
                  sVar15 = uVar14;
                }
                uVar11 = (ulong)(uVar9 >> 1) % sVar15;
                if (uVar13 < uVar14) {
                  uVar1 = *(undefined4 *)(lVar3 + 8 + lVar16);
                  uVar4 = *(undefined8 *)(lVar3 + lVar16);
                  *(undefined4 *)(lVar3 + 8 + lVar16) = *(undefined4 *)(lVar3 + 8 + uVar11 * 0xc);
                  *(undefined8 *)(lVar3 + lVar16) = *(undefined8 *)(lVar3 + uVar11 * 0xc);
                  *(undefined4 *)(lVar3 + 8 + uVar11 * 0xc) = uVar1;
                  *(undefined8 *)(lVar3 + uVar11 * 0xc) = uVar4;
                }
                else {
                  __args = (Triangle *)(lVar3 + uVar11 * 0xc);
                  if (__position._M_current == (Triangle *)plVar10[0x19]) {
                    std::
                    vector<embree::SceneGraph::TriangleMeshNode::Triangle,std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>>
                    ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle_const&>
                              ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>>
                                *)(plVar10 + 0x17),__position,__args);
                  }
                  else {
                    (__position._M_current)->v2 = __args->v2;
                    uVar9 = __args->v1;
                    (__position._M_current)->v0 = __args->v0;
                    (__position._M_current)->v1 = uVar9;
                    plVar10[0x18] = plVar10[0x18] + 0xc;
                  }
                }
                uVar13 = uVar13 + 1;
                lVar16 = lVar16 + 0xc;
              } while (N != uVar13);
            }
            (**(code **)(*plVar10 + 0x18))(plVar10);
          }
        }
      }
      else {
        (**(code **)(*plVar10 + 0x10))(plVar10);
        lVar16 = plVar10[0xd];
        if (plVar10[0xe] != lVar16) {
          uVar13 = 0;
          do {
            pNVar2 = *(Node **)(lVar16 + uVar13 * 8);
            local_40.ptr = pNVar2;
            if (pNVar2 != (Node *)0x0) {
              (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
            }
            resize_randomly(sampler,&local_40,N);
            if (pNVar2 != (Node *)0x0) {
              (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
            }
            uVar13 = uVar13 + 1;
            lVar16 = plVar10[0xd];
          } while (uVar13 < (ulong)(plVar10[0xe] - lVar16 >> 3));
        }
        (**(code **)(*plVar10 + 0x18))(plVar10);
      }
    }
    else {
      (**(code **)(*plVar10 + 0x10))(plVar10);
      pNVar2 = (Node *)plVar10[0x13];
      local_38.ptr = pNVar2;
      if (pNVar2 != (Node *)0x0) {
        (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
      }
      resize_randomly(sampler,&local_38,N);
      if (pNVar2 != (Node *)0x0) {
        (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
      }
      (**(code **)(*plVar10 + 0x18))(plVar10);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }